

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

float duckdb::TryCastCInternal<double,float,duckdb::TryCast>
                (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  double input;
  float result_value;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  duckdb_result *in_stack_ffffffffffffffc0;
  undefined4 local_24;
  undefined4 local_4;
  
  input = UnsafeFetch<double>(in_stack_ffffffffffffffc0,
                              CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                              0x1946707);
  bVar1 = TryCast::Operation<double,float>
                    (input,(float *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                     false);
  if (bVar1) {
    local_4 = local_24;
  }
  else {
    local_4 = FetchDefaultValue::Operation<float>();
  }
  return local_4;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}